

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O2

const_iterator __thiscall
ctemplate::
small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::find(small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
       *this,key_type *key)

{
  ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *pMVar1;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_ctemplate::TemplateString>,_std::_Select1st<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>
  *this_00;
  const_iterator cVar2;
  ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *pMVar3;
  long lVar4;
  ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *pMVar5;
  long lVar6;
  const_iterator cVar7;
  
  lVar4 = (long)this->size_;
  if (lVar4 < 0) {
    this_00 = &map(this)->_M_t;
    cVar2 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_ctemplate::TemplateString>,_std::_Select1st<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>
            ::find(this_00,key);
    pMVar3 = (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)0x0;
  }
  else {
    lVar6 = lVar4 + 1;
    cVar2._M_node = (_Base_ptr)0x0;
    pMVar5 = (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
             ((long)&this[-1].field_2 + 0x88);
    do {
      lVar6 = lVar6 + -1;
      if (lVar6 == 0) {
        pMVar3 = (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
                 ((long)&this->field_2 + lVar4 * 0x28);
        cVar2._M_node = (_Base_ptr)0x0;
        break;
      }
      pMVar3 = pMVar5 + 1;
      pMVar1 = pMVar5 + 1;
      pMVar5 = pMVar3;
    } while (*(key_type *)pMVar1->space_ != *key);
  }
  cVar7.hash_iter_._M_node = cVar2._M_node;
  cVar7.array_iter_ = pMVar3;
  return cVar7;
}

Assistant:

const_iterator find(const key_type& key) const {
    key_equal compare;
    if (size_ >= 0) {
      for (int i = 0; i < size_; i++) {
        if (compare(array_[i]->first, key)) {
          return const_iterator(array_ + i);
        }
      }
      return const_iterator(array_ + size_);
    } else {
      return const_iterator(map()->find(key));
    }
  }